

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3_both.cc
# Opt level: O0

ssl_open_record_t
bssl::read_v2_client_hello(SSL *ssl,size_t *out_consumed,Span<const_unsigned_char> in)

{
  byte bVar1;
  SSL3_STATE *pSVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  byte *pbVar6;
  pointer pSVar7;
  uint8_t *puVar8;
  BUF_MEM *__p;
  pointer pbVar9;
  cbb_st *pcVar10;
  size_t in_R9;
  Span<const_unsigned_char> in_00;
  uint local_194 [2];
  uint32_t cipher_spec;
  undefined1 local_180 [8];
  CBB cipher_suites;
  CBB hello_body;
  ScopedCBB client_hello;
  size_t max_v3_client_hello;
  uint8_t random [32];
  size_t local_c0;
  size_t rand_len;
  CBS challenge;
  CBS session_id;
  CBS cipher_specs;
  ushort local_80;
  ushort local_7e;
  uint16_t local_7c;
  uint16_t challenge_length;
  uint16_t session_id_length;
  uint16_t cipher_spec_length;
  uint16_t version;
  uint8_t msg_type;
  uchar *local_70;
  Span<const_unsigned_char> local_68;
  Span<const_unsigned_char> local_58;
  undefined1 local_48 [8];
  CBS v2_client_hello;
  size_t msg_length;
  size_t *out_consumed_local;
  SSL *ssl_local;
  Span<const_unsigned_char> in_local;
  
  in_local.data_ = (uchar *)in.size_;
  ssl_local = (SSL *)in.data_;
  *out_consumed = 0;
  sVar5 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&ssl_local);
  if (sVar5 < 5) {
    __assert_fail("in.size() >= SSL3_RT_HEADER_LENGTH",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/s3_both.cc"
                  ,0x102,
                  "ssl_open_record_t bssl::read_v2_client_hello(SSL *, size_t *, Span<const uint8_t>)"
                 );
  }
  pbVar6 = Span<const_unsigned_char>::operator[]((Span<const_unsigned_char> *)&ssl_local,0);
  bVar1 = *pbVar6;
  pbVar6 = Span<const_unsigned_char>::operator[]((Span<const_unsigned_char> *)&ssl_local,1);
  v2_client_hello.len = (size_t)(int)((bVar1 & 0x7f) << 8 | (uint)*pbVar6);
  if (0x1000 < v2_client_hello.len) {
    ERR_put_error(0x10,0,200,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/s3_both.cc"
                  ,0x106);
    return ssl_open_record_error;
  }
  if (v2_client_hello.len < 3) {
    ERR_put_error(0x10,0,199,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/s3_both.cc"
                  ,0x10d);
    return ssl_open_record_error;
  }
  sVar5 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&ssl_local);
  if (sVar5 < v2_client_hello.len + 2) {
    *out_consumed = v2_client_hello.len + 2;
    return ssl_open_record_partial;
  }
  local_58 = Span<const_unsigned_char>::subspan
                       ((Span<const_unsigned_char> *)&ssl_local,2,v2_client_hello.len);
  cbs_st::cbs_st((cbs_st *)local_48,local_58);
  pSVar7 = std::unique_ptr<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>::operator->(&ssl->s3->hs);
  local_68 = cbs_st::operator_cast_to_Span((cbs_st *)local_48);
  bVar3 = SSLTranscript::Update(&pSVar7->transcript,local_68);
  if (!bVar3) {
    return ssl_open_record_error;
  }
  _session_id_length = cbs_st::operator_cast_to_Span((cbs_st *)local_48);
  in_00.size_ = in_R9;
  in_00.data_ = local_70;
  ssl_do_msg_callback((bssl *)ssl,(SSL *)0x0,0,(int)session_id_length,in_00);
  iVar4 = CBS_get_u8((CBS *)local_48,(uint8_t *)((long)&challenge_length + 1));
  if ((((((iVar4 == 0) || (iVar4 = CBS_get_u16((CBS *)local_48,&local_7c), iVar4 == 0)) ||
        (iVar4 = CBS_get_u16((CBS *)local_48,&local_7e), iVar4 == 0)) ||
       ((iVar4 = CBS_get_u16((CBS *)local_48,&local_80), iVar4 == 0 ||
        (iVar4 = CBS_get_u16((CBS *)local_48,(uint16_t *)((long)&cipher_specs.len + 6)), iVar4 == 0)
        ))) || ((iVar4 = CBS_get_bytes((CBS *)local_48,(CBS *)&session_id.len,(ulong)local_7e),
                iVar4 == 0 ||
                ((iVar4 = CBS_get_bytes((CBS *)local_48,(CBS *)&challenge.len,(ulong)local_80),
                 iVar4 == 0 ||
                 (iVar4 = CBS_get_bytes((CBS *)local_48,(CBS *)&rand_len,
                                        (ulong)cipher_specs.len._6_2_), iVar4 == 0)))))) ||
     (sVar5 = CBS_len((CBS *)local_48), sVar5 != 0)) {
    ERR_put_error(0x10,0,0x89,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/s3_both.cc"
                  ,0x12e);
    return ssl_open_record_error;
  }
  if (challenge_length._1_1_ != '\x01') {
    __assert_fail("msg_type == SSL2_MT_CLIENT_HELLO",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/s3_both.cc"
                  ,0x133,
                  "ssl_open_record_t bssl::read_v2_client_hello(SSL *, size_t *, Span<const uint8_t>)"
                 );
  }
  local_c0 = CBS_len((CBS *)&rand_len);
  if (0x20 < local_c0) {
    local_c0 = 0x20;
  }
  ::OPENSSL_memset(&max_v3_client_hello,0,0x20);
  puVar8 = CBS_data((CBS *)&rand_len);
  ::OPENSSL_memcpy(random + (0x18 - local_c0),puVar8,local_c0);
  sVar5 = CBS_len((CBS *)&session_id.len);
  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)((long)&hello_body.u + 0x18));
  bVar3 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&ssl->s3->hs_buf);
  if (!bVar3) {
    pSVar2 = ssl->s3;
    __p = BUF_MEM_new();
    std::unique_ptr<buf_mem_st,_bssl::internal::Deleter>::reset(&pSVar2->hs_buf,(pointer)__p);
  }
  bVar3 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&ssl->s3->hs_buf);
  if (bVar3) {
    pbVar9 = std::unique_ptr<buf_mem_st,_bssl::internal::Deleter>::get(&ssl->s3->hs_buf);
    iVar4 = BUF_MEM_reserve(pbVar9,(sVar5 / 3) * 2 + 0x2b);
    if (iVar4 != 0) {
      pcVar10 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                          ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                           ((long)&hello_body.u + 0x18));
      pbVar9 = std::unique_ptr<buf_mem_st,_bssl::internal::Deleter>::operator->(&ssl->s3->hs_buf);
      puVar8 = (uint8_t *)pbVar9->data;
      pbVar9 = std::unique_ptr<buf_mem_st,_bssl::internal::Deleter>::operator->(&ssl->s3->hs_buf);
      iVar4 = CBB_init_fixed(pcVar10,puVar8,pbVar9->max);
      if (iVar4 != 0) {
        pcVar10 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                             ((long)&hello_body.u + 0x18));
        iVar4 = CBB_add_u8(pcVar10,'\x01');
        if (iVar4 != 0) {
          pcVar10 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                              ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                               ((long)&hello_body.u + 0x18));
          iVar4 = CBB_add_u24_length_prefixed(pcVar10,(CBB *)((long)&cipher_suites.u + 0x18));
          if ((((iVar4 != 0) &&
               (iVar4 = CBB_add_u16((CBB *)((long)&cipher_suites.u + 0x18),local_7c), iVar4 != 0))
              && (iVar4 = CBB_add_bytes((CBB *)((long)&cipher_suites.u + 0x18),
                                        (uint8_t *)&max_v3_client_hello,0x20), iVar4 != 0)) &&
             ((iVar4 = CBB_add_u8((CBB *)((long)&cipher_suites.u + 0x18),'\0'), iVar4 != 0 &&
              (iVar4 = CBB_add_u16_length_prefixed
                                 ((CBB *)((long)&cipher_suites.u + 0x18),(CBB *)local_180),
              iVar4 != 0)))) {
            do {
              do {
                sVar5 = CBS_len((CBS *)&session_id.len);
                if (sVar5 == 0) {
                  iVar4 = CBB_add_u8((CBB *)((long)&cipher_suites.u + 0x18),'\x01');
                  if ((iVar4 != 0) &&
                     (iVar4 = CBB_add_u8((CBB *)((long)&cipher_suites.u + 0x18),'\0'), iVar4 != 0))
                  {
                    pcVar10 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                                        ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                                         ((long)&hello_body.u + 0x18));
                    pbVar9 = std::unique_ptr<buf_mem_st,_bssl::internal::Deleter>::operator->
                                       (&ssl->s3->hs_buf);
                    iVar4 = CBB_finish(pcVar10,(uint8_t **)0x0,&pbVar9->length);
                    if (iVar4 != 0) {
                      *out_consumed = v2_client_hello.len + 2;
                      *(ushort *)&ssl->s3->field_0xdc = *(ushort *)&ssl->s3->field_0xdc & 0xfffb | 4
                      ;
                      in_local.size_._4_4_ = ssl_open_record_success;
                      goto LAB_001924f1;
                    }
                  }
                  ERR_put_error(0x10,0,0x44,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/s3_both.cc"
                                ,0x16f);
                  in_local.size_._4_4_ = ssl_open_record_error;
                  goto LAB_001924f1;
                }
                iVar4 = CBS_get_u24((CBS *)&session_id.len,local_194);
                if (iVar4 == 0) {
                  ERR_put_error(0x10,0,0x89,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/s3_both.cc"
                                ,0x15d);
                  in_local.size_._4_4_ = ssl_open_record_error;
                  goto LAB_001924f1;
                }
              } while ((local_194[0] & 0xff0000) != 0);
              iVar4 = CBB_add_u16((CBB *)local_180,(uint16_t)local_194[0]);
            } while (iVar4 != 0);
            ERR_put_error(0x10,0,0x44,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/s3_both.cc"
                          ,0x166);
            in_local.size_._4_4_ = ssl_open_record_error;
            goto LAB_001924f1;
          }
        }
      }
    }
  }
  in_local.size_._4_4_ = ssl_open_record_error;
LAB_001924f1:
  local_194[1] = 1;
  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)((long)&hello_body.u + 0x18));
  return in_local.size_._4_4_;
}

Assistant:

static ssl_open_record_t read_v2_client_hello(SSL *ssl, size_t *out_consumed,
                                              Span<const uint8_t> in) {
  *out_consumed = 0;
  assert(in.size() >= SSL3_RT_HEADER_LENGTH);
  // Determine the length of the V2ClientHello.
  size_t msg_length = ((in[0] & 0x7f) << 8) | in[1];
  if (msg_length > (1024 * 4)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_RECORD_TOO_LARGE);
    return ssl_open_record_error;
  }
  if (msg_length < SSL3_RT_HEADER_LENGTH - 2) {
    // Reject lengths that are too short early. We have already read
    // |SSL3_RT_HEADER_LENGTH| bytes, so we should not attempt to process an
    // (invalid) V2ClientHello which would be shorter than that.
    OPENSSL_PUT_ERROR(SSL, SSL_R_RECORD_LENGTH_MISMATCH);
    return ssl_open_record_error;
  }

  // Ask for the remainder of the V2ClientHello.
  if (in.size() < 2 + msg_length) {
    *out_consumed = 2 + msg_length;
    return ssl_open_record_partial;
  }

  CBS v2_client_hello = CBS(in.subspan(2, msg_length));
  // The V2ClientHello without the length is incorporated into the handshake
  // hash. This is only ever called at the start of the handshake, so hs is
  // guaranteed to be non-NULL.
  if (!ssl->s3->hs->transcript.Update(v2_client_hello)) {
    return ssl_open_record_error;
  }

  ssl_do_msg_callback(ssl, 0 /* read */, 0 /* V2ClientHello */,
                      v2_client_hello);

  uint8_t msg_type;
  uint16_t version, cipher_spec_length, session_id_length, challenge_length;
  CBS cipher_specs, session_id, challenge;
  if (!CBS_get_u8(&v2_client_hello, &msg_type) ||
      !CBS_get_u16(&v2_client_hello, &version) ||
      !CBS_get_u16(&v2_client_hello, &cipher_spec_length) ||
      !CBS_get_u16(&v2_client_hello, &session_id_length) ||
      !CBS_get_u16(&v2_client_hello, &challenge_length) ||
      !CBS_get_bytes(&v2_client_hello, &cipher_specs, cipher_spec_length) ||
      !CBS_get_bytes(&v2_client_hello, &session_id, session_id_length) ||
      !CBS_get_bytes(&v2_client_hello, &challenge, challenge_length) ||
      CBS_len(&v2_client_hello) != 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    return ssl_open_record_error;
  }

  // msg_type has already been checked.
  assert(msg_type == SSL2_MT_CLIENT_HELLO);

  // The client_random is the V2ClientHello challenge. Truncate or left-pad with
  // zeros as needed.
  size_t rand_len = CBS_len(&challenge);
  if (rand_len > SSL3_RANDOM_SIZE) {
    rand_len = SSL3_RANDOM_SIZE;
  }
  uint8_t random[SSL3_RANDOM_SIZE];
  OPENSSL_memset(random, 0, SSL3_RANDOM_SIZE);
  OPENSSL_memcpy(random + (SSL3_RANDOM_SIZE - rand_len), CBS_data(&challenge),
                 rand_len);

  // Write out an equivalent TLS ClientHello directly to the handshake buffer.
  size_t max_v3_client_hello = SSL3_HM_HEADER_LENGTH + 2 /* version */ +
                               SSL3_RANDOM_SIZE + 1 /* session ID length */ +
                               2 /* cipher list length */ +
                               CBS_len(&cipher_specs) / 3 * 2 +
                               1 /* compression length */ + 1 /* compression */;
  ScopedCBB client_hello;
  CBB hello_body, cipher_suites;
  if (!ssl->s3->hs_buf) {
    ssl->s3->hs_buf.reset(BUF_MEM_new());
  }
  if (!ssl->s3->hs_buf ||
      !BUF_MEM_reserve(ssl->s3->hs_buf.get(), max_v3_client_hello) ||
      !CBB_init_fixed(client_hello.get(), (uint8_t *)ssl->s3->hs_buf->data,
                      ssl->s3->hs_buf->max) ||
      !CBB_add_u8(client_hello.get(), SSL3_MT_CLIENT_HELLO) ||
      !CBB_add_u24_length_prefixed(client_hello.get(), &hello_body) ||
      !CBB_add_u16(&hello_body, version) ||
      !CBB_add_bytes(&hello_body, random, SSL3_RANDOM_SIZE) ||
      // No session id.
      !CBB_add_u8(&hello_body, 0) ||
      !CBB_add_u16_length_prefixed(&hello_body, &cipher_suites)) {
    return ssl_open_record_error;
  }

  // Copy the cipher suites.
  while (CBS_len(&cipher_specs) > 0) {
    uint32_t cipher_spec;
    if (!CBS_get_u24(&cipher_specs, &cipher_spec)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
      return ssl_open_record_error;
    }

    // Skip SSLv2 ciphers.
    if ((cipher_spec & 0xff0000) != 0) {
      continue;
    }
    if (!CBB_add_u16(&cipher_suites, cipher_spec)) {
      OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
      return ssl_open_record_error;
    }
  }

  // Add the null compression scheme and finish.
  if (!CBB_add_u8(&hello_body, 1) ||  //
      !CBB_add_u8(&hello_body, 0) ||  //
      !CBB_finish(client_hello.get(), NULL, &ssl->s3->hs_buf->length)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return ssl_open_record_error;
  }

  *out_consumed = 2 + msg_length;
  ssl->s3->is_v2_hello = true;
  return ssl_open_record_success;
}